

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
cfgfile::details::parser_base_t<cfgfile::string_trait_t>::check_parser_state_after_parsing
          (parser_base_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  _Elt_pointer pptVar2;
  exception_t<cfgfile::string_trait_t> *peVar3;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->m_stack).c.
      super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_stack).c.
      super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    peVar3 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_110 = local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"Unexpected end of file. Still unfinished tag \"","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_110,local_110 + local_108);
    pptVar2 = (this->m_stack).c.
              super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar2 ==
        (this->m_stack).c.
        super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pptVar2 = (this->m_stack).c.
                super__Deque_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    std::operator+(&local_90,&local_b0,&pptVar2[-1]->m_name);
    local_f0 = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"\".","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_f0,local_f0 + local_e8);
    std::operator+(&local_50,&local_90,&local_d0);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar3,&local_50);
    __cxa_throw(peVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  if (this->m_tag->m_is_mandatory == true) {
    bVar1 = tag_t<cfgfile::string_trait_t>::is_defined(this->m_tag);
    if (!bVar1) {
      peVar3 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      local_110 = local_100;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"Undefined mandatory tag: \"","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_110,local_110 + local_108)
      ;
      std::operator+(&local_90,&local_b0,&this->m_tag->m_name);
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"\".","");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_f0,local_f0 + local_e8);
      std::operator+(&local_70,&local_90,&local_d0);
      exception_t<cfgfile::string_trait_t>::exception_t(peVar3,&local_70);
      __cxa_throw(peVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  return;
}

Assistant:

void check_parser_state_after_parsing()
	{
		if( !m_stack.empty() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Still unfinished tag \"" ) + m_stack.top()->name() +
				Trait::from_ascii( "\"." ) );

		if( m_tag.is_mandatory() && !m_tag.is_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined mandatory tag: \"" ) +
				m_tag.name() + Trait::from_ascii( "\"." ) );
	}